

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::SampleMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  int iVar1;
  pointer pmVar2;
  iterator iVar3;
  long lVar4;
  pointer piVar5;
  pointer piVar6;
  mapped_type_conflict3 *pmVar7;
  _Base_ptr p_Var8;
  vector<float,std::allocator<float>> *pvVar9;
  code *pcVar10;
  _Rb_tree_node_base *p_Var11;
  undefined4 in_register_0000000c;
  _Base_ptr p_Var12;
  long *plVar13;
  float *pfVar14;
  aggreports *this_00;
  float fVar15;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x_1;
  summary_id_period_key sk;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  summary_id_period_key sk_1;
  map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  items;
  key_type local_f8;
  float fStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  aggreports *local_e0;
  _Rb_tree_node_base *local_d8;
  key_type local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> *local_b0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_a8;
  _Base_ptr local_78;
  _Base_ptr local_70;
  key_type local_68;
  _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  local_60;
  
  local_b0 = fileIDs;
  if (this->samplesize_ != 0) {
    local_d8 = (_Rb_tree_node_base *)CONCAT44(local_d8._4_4_,eptype_tvar);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e0 = this;
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var8 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var12 = &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var8 != p_Var12) {
      plVar13 = (long *)(&local_a8._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                        CONCAT44(in_register_0000000c,epcalc));
      do {
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             CONCAT44(local_a8._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                      *(undefined4 *)&p_Var8[1]._M_left);
        p_Var11 = p_Var8 + 1;
        local_a8._M_impl._0_4_ = p_Var11->_M_color;
        local_a8._M_impl._4_4_ = *(undefined4 *)&p_Var8[1].field_0x4;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)&p_Var8[1]._M_parent;
        local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ =
             *(undefined4 *)((long)&p_Var8[1]._M_parent + 4);
        local_d0.summary_id = p_Var11->_M_color;
        local_d0.period_no = *(int *)&p_Var11->field_0x4;
        pcVar10 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          pcVar10 = *(code **)(*plVar13 + -1 + GetOutLoss);
        }
        fVar15 = (float)(*pcVar10)(plVar13);
        iVar1 = local_e0->samplesize_;
        pmVar7 = std::
                 map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                 ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                               *)&local_60,&local_d0);
        *pmVar7 = fVar15 / (float)iVar1 + *pmVar7;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != p_Var12);
    }
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a8._M_impl.super__Rb_tree_header._M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = *(float *)&p_Var8[1]._M_parent;
        local_d0.summary_id = p_Var8[1]._M_color;
        local_d0.period_no = *(int *)&p_Var8[1].field_0x4;
        pvVar9 = (vector<float,std::allocator<float>> *)
                 std::
                 map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                               *)&local_a8,&local_d0.summary_id);
        iVar3._M_current = *(float **)(pvVar9 + 8);
        if (iVar3._M_current == *(float **)(pvVar9 + 0x10)) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (pvVar9,iVar3,(float *)&local_c8);
        }
        else {
          *iVar3._M_current =
               local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start._0_4_;
          *(float **)(pvVar9 + 8) = iVar3._M_current + 1;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
    }
    this_00 = local_e0;
    WriteExceedanceProbabilityTable
              (local_e0,local_b0,
               (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&local_a8,(double)local_e0->totalperiods_,eptype,(int)local_d8,in_stack_00000008,1
              );
    if ((this_00->ordFlag_ == false) &&
       ((this_00->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      p_Var8 = (this_00->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_78 = &(this_00->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var8 != local_78) {
        plVar13 = (long *)((long)&uStack_ec + CONCAT44(in_register_0000000c,epcalc));
        do {
          local_d0.summary_id = p_Var8[1]._M_color;
          local_70 = p_Var8;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_c8,(vector<int,_std::allocator<int>_> *)&p_Var8[1]._M_parent);
          std::
          _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
          ::clear(&local_60);
          pmVar2 = (this_00->out_loss_->
                   super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          p_Var11 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
          local_d8 = &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
          if (p_Var11 != local_d8) {
            do {
              piVar5 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              local_e8 = *(undefined4 *)&p_Var11[1]._M_left;
              local_f8.summary_id = p_Var11[1]._M_color;
              local_f8.period_no = *(int *)&p_Var11[1].field_0x4;
              fStack_f0 = *(float *)&p_Var11[1]._M_parent;
              uStack_ec = *(undefined4 *)((long)&p_Var11[1]._M_parent + 4);
              for (pfVar14 = (float *)CONCAT44(local_c8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               local_c8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
                  pfVar14 != (float *)piVar5; pfVar14 = pfVar14 + 1) {
                if (fStack_f0 == *pfVar14) {
                  local_68 = local_f8;
                  pcVar10 = (code *)GetOutLoss;
                  if ((GetOutLoss & 1) != 0) {
                    pcVar10 = *(code **)(*plVar13 + -1 + GetOutLoss);
                  }
                  fVar15 = (float)(*pcVar10)(plVar13);
                  piVar6 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  lVar4 = CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_);
                  pmVar7 = std::
                           map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                           ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                                         *)&local_60,&local_68);
                  *pmVar7 = fVar15 / (float)(ulong)((long)piVar6 - lVar4 >> 2) + *pmVar7;
                }
              }
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != local_d8);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::clear(&local_a8);
          this_00 = local_e0;
          for (p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
            fStack_f0 = *(float *)&p_Var11[1]._M_parent;
            local_f8.summary_id = p_Var11[1]._M_color;
            local_f8.period_no = *(int *)&p_Var11[1].field_0x4;
            pvVar9 = (vector<float,std::allocator<float>> *)
                     std::
                     map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                   *)&local_a8,&local_f8.summary_id);
            iVar3._M_current = *(float **)(pvVar9 + 8);
            if (iVar3._M_current == *(float **)(pvVar9 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar9,iVar3,&fStack_f0);
            }
            else {
              *iVar3._M_current = fStack_f0;
              *(float **)(pvVar9 + 8) = iVar3._M_current + 1;
            }
          }
          WriteExceedanceProbabilityTable
                    (this_00,local_b0,
                     (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                      *)&local_a8,(double)this_00->totalperiods_,eptype,local_d0.summary_id,
                     in_stack_00000008,1);
          if ((void *)CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_c8.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_));
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_70);
        } while (p_Var8 != local_78);
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_float>,_std::_Select1st<std::pair<const_summary_id_period_key,_float>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::SampleMean(const std::vector<int> &fileIDs,
			    OASIS_FLOAT (OutLosses::*GetOutLoss)(),
			    const int epcalc, const int eptype,
			    const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, OASIS_FLOAT> items;
  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    items[sk] += ((x.second.*GetOutLoss)() / samplesize_);
  }

  std::map<int, lossvec> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    items[sk] += ((x.second.*GetOutLoss)() / ensemble.second.size());
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				      ensemble.first, eptype_tvar, 1);
    }
  }

}